

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86ADD(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg op2)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  if (size != sDWORD && size != sQWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x492,"int x86ADD(unsigned char *, x86Size, x86Reg, int, x86Reg, int, x86Reg)");
  }
  uVar1 = encodeRex(stream,size == sQWORD,op2,index,base);
  puVar2 = stream + uVar1;
  *puVar2 = '\x01';
  uVar1 = encodeAddress(puVar2 + 1,index,multiplier,base,shift,(int)regCode[op2]);
  return ((int)(puVar2 + 1) + uVar1) - (int)stream;
}

Assistant:

int x86ADD(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg op2)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, op2, index, base);
	*stream++ = 0x01;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[op2]);

	return int(stream - start);
}